

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O0

void test_dashes(Am_Drawonable *d)

{
  int iVar1;
  Am_Style local_90 [8];
  Am_Style local_88 [8];
  Am_Style local_80 [8];
  Am_Style local_78 [8];
  Am_Image_Array local_70 [8];
  Am_Style local_68 [8];
  Am_Style dash3;
  Am_Style local_58 [8];
  Am_Style dash2;
  Am_Style local_48 [8];
  Am_Style dash1;
  Am_Image_Array local_30 [8];
  Am_Style local_28 [8];
  Am_Style no_dash;
  int dash3_list_length;
  int dash2_list_length;
  int x;
  int n;
  Am_Drawonable *d_local;
  
  _no_dash = 2;
  Am_Image_Array::Am_Image_Array(local_30,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_28,4,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_30);
  Am_Image_Array::~Am_Image_Array(local_30);
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&dash2,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_48,4,1,0,1,&Am_DEFAULT_DASH_LIST,2,0,0,&dash2);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&dash2);
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&dash3,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_58,4,1,0,1,test_dashes::dash2_list,6,0,0,&dash3);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&dash3);
  Am_Image_Array::Am_Image_Array(local_70,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_68,4,1,0,1,test_dashes::dash3_list,2,0,0,local_70);
  Am_Image_Array::~Am_Image_Array(local_70);
  Am_Style::Am_Style(local_78,local_28);
  Am_Style::Am_Style(local_80,local_48);
  Am_Style::Am_Style(local_88,local_58);
  Am_Style::Am_Style(local_90,local_68);
  set_style_array(local_78,local_80,local_88,local_90);
  Am_Style::~Am_Style(local_90);
  Am_Style::~Am_Style(local_88);
  Am_Style::~Am_Style(local_80);
  Am_Style::~Am_Style(local_78);
  for (dash2_list_length = 0; dash2_list_length < 4; dash2_list_length = dash2_list_length + 1) {
    iVar1 = dash2_list_length * 0x14 + 0x14;
    (**(code **)(*(long *)d + 0x140))
              (d,style_array + (long)dash2_list_length * 8,iVar1,0xa0,iVar1,300,0);
  }
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_28);
  return;
}

Assistant:

void
test_dashes(Am_Drawonable *d)
{
  int n, x;

  const int dash2_list_length = 6;
  static char dash2_list[dash2_list_length] = {3, 3, 3, 3, 9, 3};
  const int dash3_list_length = 2;
  static char dash3_list[dash3_list_length] = {16, 16};
  Am_Style no_dash(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                   Am_LINE_SOLID);
  Am_Style dash1(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH);
  Am_Style dash2(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, dash2_list, dash2_list_length);
  Am_Style dash3(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, dash3_list, dash3_list_length);

  set_style_array(no_dash, dash1, dash2, dash3);
  for (n = 0; n <= 3; n++) {
    x = 20 + (20 * n);
    d->Draw_Line(style_array[n], x, 160, x, 300);
  }
}